

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

ScriptPtr * FBehavior::StaticFindScript(int script,FBehavior **module)

{
  ulong uVar1;
  ScriptPtr *pSVar2;
  DWORD i;
  ulong uVar3;
  
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (StaticModules.Count <= uVar3) {
      return (ScriptPtr *)0x0;
    }
    pSVar2 = FindScript(StaticModules.Array[uVar3],script);
    uVar1 = uVar3 + 1;
  } while (pSVar2 == (ScriptPtr *)0x0);
  *module = StaticModules.Array[uVar3];
  return pSVar2;
}

Assistant:

const ScriptPtr *FBehavior::StaticFindScript (int script, FBehavior *&module)
{
	for (DWORD i = 0; i < StaticModules.Size(); ++i)
	{
		const ScriptPtr *code = StaticModules[i]->FindScript (script);
		if (code != NULL)
		{
			module = StaticModules[i];
			return code;
		}
	}
	return NULL;
}